

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

bool __thiscall Jinx::Impl::Parser::CheckValueType(Parser *this,SymbolListCItr currSym)

{
  byte bVar1;
  
  if (((this->m_error == false) &&
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish != currSym._M_current)) &&
     ((currSym._M_current)->type < To)) {
    bVar1 = (byte)(0x40308c0c80000000 >> ((byte)(currSym._M_current)->type & 0x3f));
  }
  else {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

inline_t bool Parser::CheckValueType(SymbolListCItr currSym) const
	{
		if (m_error || currSym == m_symbolList.end())
			return false;
		auto type = currSym->type;
		return
			type == SymbolType::Number ||
			type == SymbolType::Integer ||
			type == SymbolType::Boolean ||
			type == SymbolType::String ||
			type == SymbolType::Collection ||
			type == SymbolType::Function ||
			type == SymbolType::Coroutine ||
			type == SymbolType::Guid ||
			type == SymbolType::Null;

	}